

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.cpp
# Opt level: O0

void __thiscall llvm::ManagedStaticBase::destroy(ManagedStaticBase *this)

{
  _func_void_void_ptr *p_Var1;
  __pointer_type pvVar2;
  ManagedStaticBase *this_local;
  
  if (this->DeleterFn == (_func_void_void_ptr *)0x0) {
    __assert_fail("DeleterFn && \"ManagedStatic not initialized correctly!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ManagedStatic.cpp"
                  ,0x40,"void llvm::ManagedStaticBase::destroy() const");
  }
  if (StaticList != this) {
    __assert_fail("StaticList == this && \"Not destroyed in reverse order of construction?\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ManagedStatic.cpp"
                  ,0x42,"void llvm::ManagedStaticBase::destroy() const");
  }
  StaticList = this->Next;
  this->Next = (ManagedStaticBase *)0x0;
  p_Var1 = this->DeleterFn;
  pvVar2 = std::atomic::operator_cast_to_void_((atomic *)this);
  (*p_Var1)(pvVar2);
  std::atomic<void_*>::operator=(&this->Ptr,(__pointer_type)0x0);
  this->DeleterFn = (_func_void_void_ptr *)0x0;
  return;
}

Assistant:

void ManagedStaticBase::destroy() const {
  assert(DeleterFn && "ManagedStatic not initialized correctly!");
  assert(StaticList == this &&
         "Not destroyed in reverse order of construction?");
  // Unlink from list.
  StaticList = Next;
  Next = nullptr;

  // Destroy memory.
  DeleterFn(Ptr);

  // Cleanup.
  Ptr = nullptr;
  DeleterFn = nullptr;
}